

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader14.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::SourceArrayLoader14::begin__float_array(SourceArrayLoader14 *this)

{
  float_array__AttributeData *in_RSI;
  
  begin__float_array((SourceArrayLoader14 *)
                     &this[-1].super_IParserImpl14.super_ColladaParserAutoGen14,in_RSI);
  return;
}

Assistant:

bool SourceArrayLoader14::begin__float_array( const COLLADASaxFWL14::float_array__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__float_array(attributeData));
COLLADASaxFWL::float_array__AttributeData attrData;
attrData.present_attributes = 0;
attrData.id = attributeData.id;
attrData.name = attributeData.name;
attrData.digits = attributeData.digits;
attrData.magnitude = attributeData.magnitude;
if ( (attributeData.present_attributes & COLLADASaxFWL14::float_array__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL14::float_array__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::float_array__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__float_array(attrData);
}